

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_simd_tb(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t srcidx;
  uint32_t val;
  uint32_t srcidx_00;
  uint32_t uVar4;
  uint32_t uVar5;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 tcg_dest;
  TCGv_i32 arg4;
  TCGv_i32 arg5;
  TCGv_i32 tcg_numregs;
  TCGv_i32 tcg_regno;
  TCGv_i64 tcg_idx;
  TCGv_i64 tcg_resh;
  TCGv_i64 tcg_resl;
  int len;
  int is_tblx;
  int rd;
  int rn;
  int rm;
  int is_q;
  int op2;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar2 = extract32(insn,0x16,2);
  uVar3 = extract32(insn,0x1e,1);
  srcidx = extract32(insn,0x10,5);
  val = extract32(insn,5,5);
  srcidx_00 = extract32(insn,0,5);
  uVar4 = extract32(insn,0xc,1);
  uVar5 = extract32(insn,0xd,2);
  if (uVar2 != 0) {
    unallocated_encoding_aarch64(s);
    return;
  }
  _Var1 = fp_access_check(s);
  if (!_Var1) {
    return;
  }
  ret = tcg_temp_new_i64(tcg_ctx_00);
  ret_00 = tcg_temp_new_i64(tcg_ctx_00);
  if (uVar4 == 0) {
    tcg_gen_movi_i64_aarch64(tcg_ctx_00,ret,0);
  }
  else {
    read_vec_element(s,ret,srcidx_00,0,MO_64);
    if (uVar3 != 0) {
      read_vec_element(s,ret_00,srcidx_00,1,MO_64);
      goto LAB_00833dad;
    }
  }
  tcg_gen_movi_i64_aarch64(tcg_ctx_00,ret_00,0);
LAB_00833dad:
  tcg_dest = tcg_temp_new_i64(tcg_ctx_00);
  arg4 = tcg_const_i32_aarch64(tcg_ctx_00,val);
  arg5 = tcg_const_i32_aarch64(tcg_ctx_00,uVar5 + 1);
  read_vec_element(s,tcg_dest,srcidx,0,MO_64);
  gen_helper_simd_tbl(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,ret,tcg_dest,arg4,arg5);
  if (uVar3 != 0) {
    read_vec_element(s,tcg_dest,srcidx,1,MO_64);
    gen_helper_simd_tbl(tcg_ctx_00,ret_00,tcg_ctx_00->cpu_env,ret_00,tcg_dest,arg4,arg5);
  }
  tcg_temp_free_i64(tcg_ctx_00,tcg_dest);
  tcg_temp_free_i32(tcg_ctx_00,arg4);
  tcg_temp_free_i32(tcg_ctx_00,arg5);
  write_vec_element(s,ret,srcidx_00,0,MO_64);
  tcg_temp_free_i64(tcg_ctx_00,ret);
  write_vec_element(s,ret_00,srcidx_00,1,MO_64);
  tcg_temp_free_i64(tcg_ctx_00,ret_00);
  clear_vec_high(s,true,srcidx_00);
  return;
}

Assistant:

static void disas_simd_tb(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int op2 = extract32(insn, 22, 2);
    int is_q = extract32(insn, 30, 1);
    int rm = extract32(insn, 16, 5);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    int is_tblx = extract32(insn, 12, 1);
    int len = extract32(insn, 13, 2);
    TCGv_i64 tcg_resl, tcg_resh, tcg_idx;
    TCGv_i32 tcg_regno, tcg_numregs;

    if (op2 != 0) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    /* This does a table lookup: for every byte element in the input
     * we index into a table formed from up to four vector registers,
     * and then the output is the result of the lookups. Our helper
     * function does the lookup operation for a single 64 bit part of
     * the input.
     */
    tcg_resl = tcg_temp_new_i64(tcg_ctx);
    tcg_resh = tcg_temp_new_i64(tcg_ctx);

    if (is_tblx) {
        read_vec_element(s, tcg_resl, rd, 0, MO_64);
    } else {
        tcg_gen_movi_i64(tcg_ctx, tcg_resl, 0);
    }
    if (is_tblx && is_q) {
        read_vec_element(s, tcg_resh, rd, 1, MO_64);
    } else {
        tcg_gen_movi_i64(tcg_ctx, tcg_resh, 0);
    }

    tcg_idx = tcg_temp_new_i64(tcg_ctx);
    tcg_regno = tcg_const_i32(tcg_ctx, rn);
    tcg_numregs = tcg_const_i32(tcg_ctx, len + 1);
    read_vec_element(s, tcg_idx, rm, 0, MO_64);
    gen_helper_simd_tbl(tcg_ctx, tcg_resl, tcg_ctx->cpu_env, tcg_resl, tcg_idx,
                        tcg_regno, tcg_numregs);
    if (is_q) {
        read_vec_element(s, tcg_idx, rm, 1, MO_64);
        gen_helper_simd_tbl(tcg_ctx, tcg_resh, tcg_ctx->cpu_env, tcg_resh, tcg_idx,
                            tcg_regno, tcg_numregs);
    }
    tcg_temp_free_i64(tcg_ctx, tcg_idx);
    tcg_temp_free_i32(tcg_ctx, tcg_regno);
    tcg_temp_free_i32(tcg_ctx, tcg_numregs);

    write_vec_element(s, tcg_resl, rd, 0, MO_64);
    tcg_temp_free_i64(tcg_ctx, tcg_resl);
    write_vec_element(s, tcg_resh, rd, 1, MO_64);
    tcg_temp_free_i64(tcg_ctx, tcg_resh);
    clear_vec_high(s, true, rd);
}